

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemShallowCopy(Mem *pTo,Mem *pFrom,int srcType)

{
  ushort in_DX;
  Mem *in_RSI;
  MemValue *in_RDI;
  
  if (((ulong)in_RDI[1] & 0x2460) != 0) {
    vdbeMemClearExternAndSetNull(in_RSI);
  }
  *in_RDI = in_RSI->u;
  in_RDI[1] = *(MemValue *)&in_RSI->flags;
  in_RDI[2] = (MemValue)in_RSI->z;
  if ((in_RSI->flags & 0x800) == 0) {
    *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xe3ff;
    *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) | in_DX;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemShallowCopy(Mem *pTo, const Mem *pFrom, int srcType){
  assert( (pFrom->flags & MEM_RowSet)==0 );
  assert( pTo->db==pFrom->db );
  if( VdbeMemDynamic(pTo) ) vdbeMemClearExternAndSetNull(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  if( (pFrom->flags&MEM_Static)==0 ){
    pTo->flags &= ~(MEM_Dyn|MEM_Static|MEM_Ephem);
    assert( srcType==MEM_Ephem || srcType==MEM_Static );
    pTo->flags |= srcType;
  }
}